

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ialaw.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  ostringstream *this;
  ALawExpansion *this_00;
  char *pcVar6;
  allocator local_411;
  double compression_factor;
  double abs_max_value;
  undefined1 local_400 [32];
  double data;
  ALawExpansion a_law_expansion;
  ostringstream error_message_4;
  ifstream ifs;
  byte abStack_218 [488];
  
  abs_max_value = 32768.0;
  compression_factor = 87.6;
  do {
    while (iVar4 = ya_getopt_long(argc,argv,"v:a:h",(option *)0x0,(int *)0x0), iVar4 == 0x61) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
      bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&compression_factor);
      bVar2 = compression_factor < 1.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -a option must be a number ")
        ;
        std::operator<<(poVar5,"greater than or equal to one");
        std::__cxx11::string::string
                  ((string *)&error_message_4,"ialaw",(allocator *)&a_law_expansion);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
LAB_001028ad:
        std::__cxx11::string::~string((string *)&error_message_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar4 != 0x76) {
      if (iVar4 != -1) {
        if (iVar4 != 0x68) {
          anon_unknown.dwarf_1d60::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        anon_unknown.dwarf_1d60::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_4,"ialaw",(allocator *)&a_law_expansion);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001028ad;
      }
      if (argc == ya_optind) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_4,"ialaw",(allocator *)&a_law_expansion);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001028ad;
      }
      std::ifstream::ifstream(this);
      if ((pcVar6 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar6),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        poVar5 = std::operator<<((ostream *)&error_message_4,"Cannot open file ");
        std::operator<<(poVar5,pcVar6);
        std::__cxx11::string::string((string *)&a_law_expansion,"ialaw",(allocator *)local_400);
        sptk::PrintErrorMessage((string *)&a_law_expansion,&error_message_4);
        this_00 = &a_law_expansion;
        goto LAB_00102a2d;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this = (ostringstream *)&std::cin;
      }
      sptk::ALawExpansion::ALawExpansion(&a_law_expansion,abs_max_value,compression_factor);
      if (a_law_expansion.is_valid_ != false) {
        break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
      std::operator<<((ostream *)&error_message_4,"Failed to initialize ALawExpansion");
      std::__cxx11::string::string((string *)local_400,"ialaw",(allocator *)&data);
      sptk::PrintErrorMessage((string *)local_400,&error_message_4);
      goto LAB_00102a28;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
    bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&abs_max_value);
    bVar2 = abs_max_value <= 0.0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -v option must be a positive number");
      std::__cxx11::string::string((string *)&error_message_4,"ialaw",(allocator *)&a_law_expansion)
      ;
      sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
      goto LAB_001028ad;
    }
  } while( true );
LAB_00102925:
  bVar2 = sptk::ReadStream<double>(&data,(istream *)this);
  if (!bVar2) {
    iVar4 = 0;
    goto LAB_00102a3f;
  }
  bVar2 = sptk::ALawExpansion::Run(&a_law_expansion,&data);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to decompress");
    std::__cxx11::string::string((string *)local_400,"ialaw",&local_411);
    sptk::PrintErrorMessage((string *)local_400,&error_message_4);
    goto LAB_00102a28;
  }
  bVar2 = sptk::WriteStream<double>(data,(ostream *)&std::cout);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to write decompressed data");
    std::__cxx11::string::string((string *)local_400,"ialaw",&local_411);
    sptk::PrintErrorMessage((string *)local_400,&error_message_4);
LAB_00102a28:
    this_00 = (ALawExpansion *)local_400;
LAB_00102a2d:
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
    iVar4 = 1;
LAB_00102a3f:
    std::ifstream::~ifstream(&ifs);
    return iVar4;
  }
  goto LAB_00102925;
}

Assistant:

int main(int argc, char* argv[]) {
  double abs_max_value(kDefaultAbsMaxValue);
  double compression_factor(kDefaultCompressionFactor);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "v:a:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'v': {
        if (!sptk::ConvertStringToDouble(optarg, &abs_max_value) ||
            abs_max_value <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a positive number";
          sptk::PrintErrorMessage("ialaw", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &compression_factor) ||
            compression_factor < 1.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be a number "
                        << "greater than or equal to one";
          sptk::PrintErrorMessage("ialaw", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ialaw", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ialaw", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ialaw", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ALawExpansion a_law_expansion(abs_max_value, compression_factor);
  if (!a_law_expansion.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize ALawExpansion";
    sptk::PrintErrorMessage("ialaw", error_message);
    return 1;
  }

  double data;

  while (sptk::ReadStream(&data, &input_stream)) {
    if (!a_law_expansion.Run(&data)) {
      std::ostringstream error_message;
      error_message << "Failed to decompress";
      sptk::PrintErrorMessage("ialaw", error_message);
      return 1;
    }

    if (!sptk::WriteStream(data, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write decompressed data";
      sptk::PrintErrorMessage("ialaw", error_message);
      return 1;
    }
  }

  return 0;
}